

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O3

unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>,_true>
duckdb::roaring::RoaringInitAnalyze(ColumnData *col_data,PhysicalType type)

{
  StorageManager *pSVar1;
  idx_t iVar2;
  RoaringAnalyzeState *this;
  undefined7 in_register_00000031;
  CompressionInfo info;
  CompressionInfo local_20;
  
  pSVar1 = ColumnData::GetStorageManager((ColumnData *)CONCAT71(in_register_00000031,type));
  iVar2 = optional_idx::GetIndex(&pSVar1->storage_version);
  if (iVar2 < 4) {
    col_data->_vptr_ColumnData = (_func_int **)0x0;
  }
  else {
    local_20.block_manager = ((ColumnData *)CONCAT71(in_register_00000031,type))->block_manager;
    this = (RoaringAnalyzeState *)operator_new(0xd0);
    RoaringAnalyzeState::RoaringAnalyzeState(this,&local_20);
    col_data->_vptr_ColumnData = (_func_int **)this;
  }
  return (unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>_>)
         (unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>_>)col_data;
}

Assistant:

unique_ptr<AnalyzeState> RoaringInitAnalyze(ColumnData &col_data, PhysicalType type) {
	// check if the storage version we are writing to supports roaring
	auto &storage = col_data.GetStorageManager();
	if (storage.GetStorageVersion() < 4) {
		// compatibility mode with old versions - disable roaring
		return nullptr;
	}
	CompressionInfo info(col_data.GetBlockManager());
	auto state = make_uniq<RoaringAnalyzeState>(info);
	return std::move(state);
}